

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

void * __thiscall
GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U>::alloc
          (GrowingAllocatorRef<ChunkedStackPool<65532>,_16384U> *this,int size)

{
  uint uVar1;
  void *pvVar2;
  
  uVar1 = this->total + size;
  this->total = uVar1;
  if ((this->allocLimit < uVar1) && (this->allocLimitCallback != (_func_void_void_ptr *)0x0)) {
    (*this->allocLimitCallback)(this->allocLimitContext);
  }
  if (0x4000 < (uint)size) {
    pvVar2 = (void *)(*(code *)NULLC::alloc)(size);
    Vector::push_back(&this->largeObjects,pvVar2);
    return pvVar2;
  }
  pvVar2 = ChunkedStackPool<65532>::Allocate(this->pool,size);
  return pvVar2;
}

Assistant:

virtual void* alloc(int size)
	{
		total += size;

		if(total > allocLimit)
		{
			if(allocLimitCallback)
				allocLimitCallback(allocLimitContext);
		}

		if(unsigned(size) > fallbackSize)
		{
			void *result = NULLC::alloc(size);
			largeObjects.push_back(result);
			return result;
		}

		return pool.Allocate(size);
	}

	virtual void dealloc(void* ptr)
	{
		(void)ptr;
	}

	virtual unsigned requested()
	{
		return total;
	}

	virtual void clear_limit()
	{
		allocLimit = ~0u;
	}

	virtual void set_limit(unsigned limit, void *context, void (*callback)(void *context))
	{
		allocLimit = limit;
		allocLimitContext = context;
		allocLimitCallback = callback;
	}

	void Clear()
	{
		total = 0;

		pool.Clear();

		for(unsigned i = 0; i < largeObjects.count; i++)
			NULLC::dealloc(largeObjects.data[i]);
		largeObjects.count = 0;
	}